

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

bool tinyobj::parseReal(char **token,real_t *out)

{
  long lVar1;
  bool bVar2;
  size_t sVar3;
  real_t f;
  bool ret;
  double val;
  char *end;
  real_t *out_local;
  char **token_local;
  
  end = (char *)out;
  out_local = (real_t *)token;
  sVar3 = strspn(*token," \t");
  *(size_t *)out_local = sVar3 + *(long *)out_local;
  lVar1 = *(long *)out_local;
  sVar3 = strcspn(*(char **)out_local," \t\r");
  val = (double)(lVar1 + sVar3);
  bVar2 = tryParseDouble(*(char **)out_local,(char *)val,(double *)&f);
  if (bVar2) {
    *(float *)end = (float)_f;
  }
  *(double *)out_local = val;
  return bVar2;
}

Assistant:

static inline bool parseReal(const char **token, real_t *out) {
  (*token) += strspn((*token), " \t");
  const char *end = (*token) + strcspn((*token), " \t\r");
  double val;
  bool ret = tryParseDouble((*token), end, &val);
  if (ret) {
    real_t f = static_cast<real_t>(val);
    (*out) = f;
  }
  (*token) = end;
  return ret;
}